

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

SpectrumImageTexture *
pbrt::SpectrumImageTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Alloc_hider __s1;
  int iVar4;
  SpectrumImageTexture *pSVar5;
  MIPMap *pMVar6;
  char *pcVar7;
  bool bVar8;
  string filename;
  string encodingString;
  string wrapString;
  ColorEncodingHandle encoding;
  string filter;
  TextureMapping2DHandle map;
  WrapMode local_104;
  string local_100;
  string local_e0;
  string local_c0;
  Float local_a0;
  Float local_9c;
  string local_98;
  string local_78;
  string local_58;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  local_38;
  undefined4 extraout_var;
  
  TextureMapping2DHandle::Create
            ((TextureMapping2DHandle *)&local_38,parameters->dict,renderFromTexture,loc,alloc);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"maxanisotropy","");
  local_9c = TextureParameterDictionary::GetOneFloat(parameters,&local_78,8.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"filter","");
  paVar1 = &local_100.field_2;
  local_100._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"bilinear","");
  TextureParameterDictionary::GetOneString(&local_78,parameters,&local_c0,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar1) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_100._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"wrap","");
  paVar2 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"repeat","");
  TextureParameterDictionary::GetOneString(&local_c0,parameters,&local_100,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar1) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  __s1._M_p = local_c0._M_dataplus._M_p;
  iVar4 = strcmp(local_c0._M_dataplus._M_p,"clamp");
  bVar8 = true;
  if (iVar4 == 0) {
    local_104 = Clamp;
  }
  else {
    iVar4 = strcmp(__s1._M_p,"repeat");
    if (iVar4 == 0) {
      local_104 = Repeat;
    }
    else {
      iVar4 = strcmp(__s1._M_p,"black");
      if (iVar4 == 0) {
        local_104 = Black;
      }
      else {
        iVar4 = strcmp(__s1._M_p,"octahedralsphere");
        bVar8 = iVar4 == 0;
        local_104 = (uint)bVar8 * 3;
      }
    }
  }
  if (bVar8) {
    local_100._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"scale","");
    local_a0 = TextureParameterDictionary::GetOneFloat(parameters,&local_100,1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"filename","");
    paVar3 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
    TextureParameterDictionary::GetOneString(&local_e0,parameters,&local_58,&local_98);
    ResolveFilename(&local_100,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar3) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    local_e0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"png","");
    bVar8 = HasExtension(&local_100,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"encoding","");
    pcVar7 = "linear";
    if (bVar8) {
      pcVar7 = "sRGB";
    }
    local_98._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,pcVar7,pcVar7 + (ulong)!bVar8 * 2 + 4);
    TextureParameterDictionary::GetOneString(&local_e0,parameters,&local_58,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar3) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    ColorEncodingHandle::Get(&local_98);
    iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
    pSVar5 = (SpectrumImageTexture *)CONCAT44(extraout_var,iVar4);
    (pSVar5->super_ImageTextureBase).mapping.
    super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
    .bits = local_38.bits;
    (pSVar5->super_ImageTextureBase).scale = local_a0;
    local_58._M_dataplus._M_p = local_98._M_dataplus._M_p;
    pMVar6 = ImageTextureBase::GetTexture
                       (&local_100,&local_78,local_9c,local_104,(ColorEncodingHandle *)&local_58,
                        alloc);
    (pSVar5->super_ImageTextureBase).mipmap = pMVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    return pSVar5;
  }
  ErrorExit<std::__cxx11::string&>("%s: wrap mode unknown",&local_c0);
}

Assistant:

SpectrumImageTexture *SpectrumImageTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    // Initialize 2D texture mapping _map_ from _tp_
    TextureMapping2DHandle map =
        TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

    // Initialize _ImageTexture_ parameters
    Float maxAniso = parameters.GetOneFloat("maxanisotropy", 8.f);
    std::string filter = parameters.GetOneString("filter", "bilinear");
    std::string wrapString = parameters.GetOneString("wrap", "repeat");
    pstd::optional<WrapMode> wrapMode = ParseWrapMode(wrapString.c_str());
    if (!wrapMode)
        ErrorExit("%s: wrap mode unknown", wrapString);
    Float scale = parameters.GetOneFloat("scale", 1.f);
    std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));

    const char *defaultEncoding = HasExtension(filename, "png") ? "sRGB" : "linear";
    std::string encodingString = parameters.GetOneString("encoding", defaultEncoding);
    ColorEncodingHandle encoding = ColorEncodingHandle::Get(encodingString);

    return alloc.new_object<SpectrumImageTexture>(map, filename, filter, maxAniso,
                                                  *wrapMode, scale, encoding, alloc);
}